

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryDecoder::InitializeDictionary
          (DictionaryDecoder *this,idx_t new_dictionary_size,
          optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state,bool has_defines)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  ulong uVar1;
  ColumnReader *pCVar2;
  idx_t iVar3;
  _Head_base<0UL,_bool_*,_false> _Var4;
  unsafe_unique_array<bool> *puVar5;
  SelectionVector *__p_00;
  bool bVar6;
  pointer pVVar7;
  type pVVar8;
  TableFilter *pTVar9;
  TableFilterState *pTVar10;
  pointer __p_01;
  idx_t iVar11;
  idx_t iVar12;
  pointer __p;
  SelectionVector dict_sel;
  UnifiedVectorFormat vdata;
  optional_ptr<duckdb::TableFilterState,_true> local_118;
  optional_ptr<const_duckdb::TableFilter,_true> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  unsafe_unique_array<bool> *local_e0;
  UnifiedVectorFormat local_d8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = this->dictionary_size;
  this->dictionary_size = new_dictionary_size;
  local_e0 = &this->filter_result;
  local_118.ptr = filter_state.ptr;
  local_110.ptr = filter.ptr;
  ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
            ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)local_e0,(pointer)0x0);
  this->filter_count = 0;
  this->can_have_nulls = has_defines;
  this_00 = &this->dictionary;
  if ((this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
      .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    local_108._M_dataplus._M_p = (pointer)(this->dictionary_size + 1);
    make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long>
              ((duckdb *)&local_d8,&this->reader->column_schema->type,(unsigned_long *)&local_108);
    __p_00 = local_d8.sel;
    local_d8.sel = (SelectionVector *)0x0;
    ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
              ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)this_00,
               (pointer)__p_00);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_d8);
  }
  else if (uVar1 < this->dictionary_size) {
    pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                       (this_00);
    Vector::Resize(pVVar7,uVar1,this->dictionary_size + 1);
  }
  ::std::operator+(&local_50,&(this->reader->reader->super_BaseFileReader).file.path,"_");
  ::std::operator+(&local_70,&local_50,&this->reader->column_schema->name);
  ::std::operator+(&local_108,&local_70,"_");
  ::std::__cxx11::to_string(&local_90,this->reader->chunk_read_offset);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   &local_108,&local_90);
  ::std::__cxx11::string::operator=((string *)&this->dictionary_id,(string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  FlatVector::VerifyFlatVector(pVVar8);
  TemplatedValidityMask<unsigned_long>::Reset
            (&(pVVar8->validity).super_TemplatedValidityMask<unsigned_long>,
             this->dictionary_size + 1);
  if (this->can_have_nulls == true) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(pVVar8->validity).super_TemplatedValidityMask<unsigned_long>,this->dictionary_size)
    ;
  }
  pCVar2 = this->reader;
  iVar3 = this->dictionary_size;
  pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  (*pCVar2->_vptr_ColumnReader[0xf])(pCVar2,&pCVar2->block,0,iVar3,0,pVVar8);
  if (filter.ptr != (TableFilter *)0x0) {
    pTVar9 = optional_ptr<const_duckdb::TableFilter,_true>::operator*(&local_110);
    pTVar10 = optional_ptr<duckdb::TableFilterState,_true>::operator*(&local_118);
    bVar6 = CanFilter(this,pTVar9,pTVar10);
    if (bVar6) {
      uVar1 = this->dictionary_size;
      __p_01 = (pointer)operator_new__(uVar1);
      switchD_014c69ad::default(__p_01,0,uVar1);
      puVar5 = local_e0;
      local_d8.sel = (SelectionVector *)0x0;
      ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
                ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)local_e0,__p_01);
      ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
                ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_d8);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_d8);
      pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (this_00);
      Vector::ToUnifiedFormat(pVVar7,this->dictionary_size,&local_d8);
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      this->filter_count = this->dictionary_size;
      pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this_00);
      pTVar9 = optional_ptr<const_duckdb::TableFilter,_true>::operator*(&local_110);
      pTVar10 = optional_ptr<duckdb::TableFilterState,_true>::operator*(&local_118);
      ColumnSegment::FilterSelection
                ((SelectionVector *)&local_108,pVVar8,&local_d8,pTVar9,pTVar10,this->dictionary_size
                 ,&this->filter_count);
      iVar3 = this->filter_count;
      _Var4._M_head_impl =
           (puVar5->super_unique_ptr<bool[],_std::default_delete<bool[]>_>)._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      for (iVar11 = 0; iVar3 != iVar11; iVar11 = iVar11 + 1) {
        iVar12 = iVar11;
        if (local_108._M_dataplus._M_p != (pointer)0x0) {
          iVar12 = (idx_t)*(uint *)(local_108._M_dataplus._M_p + iVar11 * 4);
        }
        _Var4._M_head_impl[iVar12] = true;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_108.field_2._M_allocated_capacity);
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_d8);
    }
  }
  return;
}

Assistant:

void DictionaryDecoder::InitializeDictionary(idx_t new_dictionary_size, optional_ptr<const TableFilter> filter,
                                             optional_ptr<TableFilterState> filter_state, bool has_defines) {
	auto old_dict_size = dictionary_size;
	dictionary_size = new_dictionary_size;
	filter_result.reset();
	filter_count = 0;
	can_have_nulls = has_defines;
	// we use the first value in the dictionary to keep a NULL
	if (!dictionary) {
		dictionary = make_uniq<Vector>(reader.Type(), dictionary_size + 1);
	} else if (dictionary_size > old_dict_size) {
		dictionary->Resize(old_dict_size, dictionary_size + 1);
	}
	dictionary_id =
	    reader.reader.GetFileName() + "_" + reader.Schema().name + "_" + std::to_string(reader.chunk_read_offset);
	// we use the last entry as a NULL, dictionary vectors don't have a separate validity mask
	auto &dict_validity = FlatVector::Validity(*dictionary);
	dict_validity.Reset(dictionary_size + 1);
	if (can_have_nulls) {
		dict_validity.SetInvalid(dictionary_size);
	}
	reader.Plain(reader.block, nullptr, dictionary_size, 0, *dictionary);

	if (filter && CanFilter(*filter, *filter_state)) {
		// no filter result yet - apply filter to the dictionary
		// initialize the filter result - setting everything to false
		filter_result = make_unsafe_uniq_array<bool>(dictionary_size);

		// apply the filter
		UnifiedVectorFormat vdata;
		dictionary->ToUnifiedFormat(dictionary_size, vdata);
		SelectionVector dict_sel;
		filter_count = dictionary_size;
		ColumnSegment::FilterSelection(dict_sel, *dictionary, vdata, *filter, *filter_state, dictionary_size,
		                               filter_count);

		// now set all matching tuples to true
		for (idx_t i = 0; i < filter_count; i++) {
			auto idx = dict_sel.get_index(i);
			filter_result[idx] = true;
		}
	}
}